

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_mmu.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_433923::NesMmuTest_controller_2_Test::~NesMmuTest_controller_2_Test
          (NesMmuTest_controller_2_Test *this)

{
  NesMmuTest::~NesMmuTest(&this->super_NesMmuTest);
  operator_delete(this,0x4c8);
  return;
}

Assistant:

TEST_F(NesMmuTest, controller_2) {
    // No button pressed, extra reads at end to make sure controller is not read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));

    // Latch controller button states by toggling strobe (0x4016, bit 0), now
    // new controller read is possible (while stope is high, button A's state
    // should be returned on read)
    mmu->write_byte(0x4016, 0x01);
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(false));
    EXPECT_EQ(0x40, mmu->read_byte(0x4017));
    mmu->write_byte(0x4016, 0x00);

    // All buttons pressed, extra reads at end to make sure controller is not
    // read
    EXPECT_CALL(controller2, get(INesController::Button::A))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::B))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Select))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Start))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Up))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Down))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Left))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_CALL(controller2, get(INesController::Button::Right))
            .WillOnce(testing::Return(true));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
    EXPECT_EQ(0x41, mmu->read_byte(0x4017));
}